

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrFaceExpressionSet2FB value)

{
  bool bVar1;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b8;
  allocator local_99;
  string local_98 [8];
  string error_str;
  allocator local_61;
  string local_60 [8];
  string vuid;
  XrFaceExpressionSet2FB value_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *item_name_local;
  string *validation_name_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
     (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_FB_face_tracking2"), !bVar1))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"VUID-",&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::operator+=(local_60,(string *)validation_name);
    std::__cxx11::string::operator+=(local_60,"-");
    std::__cxx11::string::operator+=(local_60,(string *)item_name);
    std::__cxx11::string::operator+=(local_60,"-parameter");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"XrFaceExpressionSet2FB requires extension ",&local_99);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::operator+=
              (local_98," \"XR_FB_face_tracking2\" to be enabled, but it is not enabled");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_b8,objects_info);
    CoreValidLogMessage(instance_info,(string *)local_60,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                        command_name,&local_b8,(string *)local_98);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_b8);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_60);
    return false;
  }
  return value == XR_FACE_EXPRESSION_SET2_DEFAULT_FB;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrFaceExpressionSet2FB value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_FB_face_tracking2, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_FB_face_tracking2")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrFaceExpressionSet2FB requires extension ";
        error_str += " \"XR_FB_face_tracking2\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_FACE_EXPRESSION_SET2_DEFAULT_FB:
            return true;
    default:
        return false;
}
}